

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

string * __thiscall
flatbuffers::python::PythonGenerator::GenGetter_abi_cxx11_
          (string *__return_storage_ptr__,PythonGenerator *this,Type *type)

{
  BaseType BVar1;
  long lVar2;
  long *plVar3;
  EnumDef **ppEVar4;
  size_type *psVar5;
  char *pcVar6;
  char *pcVar7;
  Type local_80;
  long *local_60 [2];
  long local_50 [2];
  string local_40;
  
  BVar1 = type->base_type;
  if (BVar1 == BASE_TYPE_UNION) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "self._tab.Union(";
    pcVar6 = "";
  }
  else {
    if (BVar1 == BASE_TYPE_VECTOR) {
      local_80.struct_def = type->struct_def;
      local_80.enum_def = type->enum_def;
      local_80.element = BASE_TYPE_NONE;
      local_80.base_type = type->element;
      local_80.fixed_length = type->fixed_length;
      GenGetter_abi_cxx11_(__return_storage_ptr__,this,&local_80);
      return __return_storage_ptr__;
    }
    if (BVar1 != BASE_TYPE_STRING) {
      GenTypeGet_abi_cxx11_(&local_40,this,type);
      (*(this->namer_).super_Namer._vptr_Namer[0x14])
                (local_60,&this->namer_,&local_40,(ulong)(this->namer_).super_Namer.config_.methods)
      ;
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,0x379e4a);
      ppEVar4 = (EnumDef **)(plVar3 + 2);
      if ((EnumDef **)*plVar3 == ppEVar4) {
        local_80.enum_def = *ppEVar4;
        local_80._24_8_ = plVar3[3];
        local_80._0_8_ = &local_80.enum_def;
      }
      else {
        local_80.enum_def = *ppEVar4;
        local_80._0_8_ = (EnumDef **)*plVar3;
      }
      local_80.struct_def = (StructDef *)plVar3[1];
      *plVar3 = (long)ppEVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar5) {
        lVar2 = plVar3[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      }
      __return_storage_ptr__->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((EnumDef **)local_80._0_8_ != &local_80.enum_def) {
        operator_delete((void *)local_80._0_8_,
                        (ulong)((long)&((local_80.enum_def)->super_Definition).name._M_dataplus._M_p
                               + 1));
      }
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == &local_40.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "self._tab.String(";
    pcVar6 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

std::string GenGetter(const Type &type) const {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "self._tab.String(";
      case BASE_TYPE_UNION: return "self._tab.Union(";
      case BASE_TYPE_VECTOR: return GenGetter(type.VectorType());
      default:
        return "self._tab.Get(flatbuffers.number_types." +
               namer_.Method(GenTypeGet(type)) + "Flags, ";
    }
  }